

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::resizeRefsList
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  MemoryMonitorInterface *pMVar4;
  BuildRef *ptr;
  undefined8 uVar5;
  char cVar6;
  size_t i;
  unsigned_long uVar7;
  BuildRef *pBVar8;
  runtime_error *this_00;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  unsigned_long uVar12;
  plus<unsigned_long> local_101;
  anon_class_8_1_8991fb9c local_100;
  unsigned_long local_f8;
  anon_class_16_2_ed117de8_conflict32 local_f0;
  anon_class_24_3_8ee612a4_conflict3 local_e0;
  blocked_range<unsigned_long> local_c8;
  task_group_context context;
  
  sVar3 = (this->scene->geometries).size_active;
  local_f8 = 0;
  local_e0.func = &local_100;
  local_100.this = this;
  local_e0.identity = &local_f8;
  local_e0.reduction = &local_101;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_c8.my_begin = 0;
  local_c8.my_grainsize = 1;
  local_f0.reduction = &local_101;
  local_f0.func = &local_e0;
  local_c8.my_end = sVar3;
  uVar7 = tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_std::plus<unsigned_long>_>
                    (&local_c8,&local_f8,&local_f0,&local_101,&context);
  cVar6 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar6 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"task cancelled");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  if ((this->refs).size_active < uVar7) {
    uVar10 = (this->refs).size_alloced;
    if (uVar10 < uVar7) {
      uVar11 = uVar10;
      uVar12 = uVar7;
      if (uVar10 != 0) {
        for (; uVar12 = uVar11, uVar11 < uVar7; uVar11 = uVar11 * 2 + (ulong)(uVar11 * 2 == 0)) {
        }
      }
      if (uVar10 != uVar12) {
        pMVar4 = (this->refs).alloc.device;
        ptr = (this->refs).items;
        uVar10 = uVar12 << 6;
        (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,uVar10,0);
        if (uVar10 < 0x1c00000) {
          pBVar8 = (BuildRef *)alignedMalloc(uVar10,0x20);
        }
        else {
          pBVar8 = (BuildRef *)os_malloc(uVar10,&(this->refs).alloc.hugepages);
        }
        lVar9 = 0x20;
        (this->refs).items = pBVar8;
        for (uVar10 = 0; uVar10 < (this->refs).size_active; uVar10 = uVar10 + 1) {
          pBVar8 = (this->refs).items;
          puVar1 = (undefined8 *)((long)ptr + lVar9 + -0x20);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)pBVar8 + lVar9 + -0x20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          puVar1 = (undefined8 *)((long)ptr + lVar9 + -0x10);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)pBVar8 + lVar9 + -0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          *(undefined8 *)((long)&(pBVar8->super_PrimRef).lower.field_0 + lVar9) =
               *(undefined8 *)((long)&(ptr->super_PrimRef).lower.field_0 + lVar9);
          *(undefined4 *)((long)&(pBVar8->super_PrimRef).lower.field_0 + lVar9 + 8) =
               *(undefined4 *)((long)&(ptr->super_PrimRef).lower.field_0 + lVar9 + 8);
          lVar9 = lVar9 + 0x40;
        }
        sVar3 = (this->refs).size_alloced;
        if (ptr != (BuildRef *)0x0) {
          if (sVar3 << 6 < 0x1c00000) {
            alignedFree(ptr);
          }
          else {
            os_free(ptr,sVar3 << 6,(this->refs).alloc.hugepages);
          }
        }
        if (sVar3 != 0) {
          pMVar4 = (this->refs).alloc.device;
          (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,sVar3 * -0x40,1);
        }
        (this->refs).size_active = uVar7;
        (this->refs).size_alloced = uVar12;
        return;
      }
    }
    (this->refs).size_active = uVar7;
  }
  return;
}

Assistant:

void resizeRefsList ()
      {
        size_t num = parallel_reduce (size_t(0), scene->size(), size_t(0), 
          [this](const range<size_t>& r)->size_t {
            size_t c = 0;
            for (auto i=r.begin(); i<r.end(); ++i) {
              Mesh* mesh = scene->getSafe<Mesh>(i);
              if (mesh == nullptr || mesh->numTimeSteps != 1)
                continue;
              size_t meshSize = mesh->size();
              c += isSmallGeometry(mesh) ? Primitive::blocks(meshSize) : 1;
            }
            return c;
          },
          std::plus<size_t>()
        );

        if (refs.size() < num) {
          refs.resize(num);
        }
      }